

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void __thiscall NALUnit::updateBits(NALUnit *this,int bitOffset,int bitLen,uint value)

{
  uint num;
  uint8_t *puVar1;
  uint num_00;
  int postfix;
  int prefix;
  int endBitsPostfix;
  uint8_t *ptr_end;
  undefined1 local_48 [4];
  int byteOffset;
  BitStreamWriter bitWriter;
  uint8_t *ptr;
  uint value_local;
  int bitLen_local;
  int bitOffset_local;
  NALUnit *this_local;
  
  puVar1 = BitStream::getBuffer(&(this->bitReader).super_BitStream);
  bitWriter._24_8_ = puVar1 + bitOffset / 8;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_48);
  num_00 = bitOffset % 8;
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)local_48,(uint8_t *)bitWriter._24_8_,
             (uint8_t *)(bitWriter._24_8_ + (long)(bitLen / 8 + 5)));
  puVar1 = BitStream::getBuffer(&(this->bitReader).super_BitStream);
  num = 8 - (bitOffset + bitLen) % 8;
  if (0 < (int)num_00) {
    BitStreamWriter::putBits
              ((BitStreamWriter *)local_48,num_00,
               (int)(uint)*(byte *)bitWriter._24_8_ >> (8U - (char)num_00 & 0x1f));
  }
  BitStreamWriter::putBits((BitStreamWriter *)local_48,bitLen,value);
  if ((int)num < 8) {
    BitStreamWriter::putBits
              ((BitStreamWriter *)local_48,num,
               (uint)puVar1[(bitOffset + bitLen) / 8] & (1 << ((byte)num & 0x1f)) - 1U);
  }
  BitStreamWriter::flushBits((BitStreamWriter *)local_48);
  return;
}

Assistant:

void NALUnit::updateBits(const int bitOffset, const int bitLen, const unsigned value) const
{
    // uint8_t* ptr = m_getbitContextBuffer + (bitOffset/8);
    uint8_t* ptr = bitReader.getBuffer() + bitOffset / 8;
    BitStreamWriter bitWriter{};
    const int byteOffset = bitOffset % 8;
    bitWriter.setBuffer(ptr, ptr + (bitLen / 8 + 5));

    const uint8_t* ptr_end = bitReader.getBuffer() + (bitOffset + bitLen) / 8;
    const int endBitsPostfix = 8 - ((bitOffset + bitLen) % 8);

    if (byteOffset > 0)
    {
        const int prefix = *ptr >> (8 - byteOffset);
        bitWriter.putBits(byteOffset, prefix);
    }
    bitWriter.putBits(bitLen, value);

    if (endBitsPostfix < 8)
    {
        const int postfix = *ptr_end & (1 << endBitsPostfix) - 1;
        bitWriter.putBits(endBitsPostfix, postfix);
    }
    bitWriter.flushBits();
}